

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::IsValid(ON_PolyCurve *this,bool bAllowGaps,ON_TextLog *text_log)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar12 = (ulong)uVar7;
  uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if ((int)uVar7 < 1 || (int)uVar5 < 1) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00584d67;
    pcVar9 = "Polycurve segment count = %d and dim = %d\n";
    uVar8 = (ulong)uVar5;
  }
  else {
    uVar1 = (this->m_t).m_count;
    uVar8 = (ulong)uVar1;
    if (uVar1 == uVar7 + 1) {
      uVar11 = 0;
      do {
        pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar11];
        if (pOVar2 == (ON_Curve *)0x0) {
          if (text_log != (ON_TextLog *)0x0) {
            pcVar9 = "Polycurve segment[%d] is null.\n";
LAB_00584d94:
            ON_TextLog::Print(text_log,pcVar9,uVar11 & 0xffffffff);
          }
          goto LAB_00584d67;
        }
        iVar6 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(pOVar2,text_log);
        if ((char)iVar6 == '\0') {
          if (text_log != (ON_TextLog *)0x0) {
            pcVar9 = "Polycurve segment[%d] is not valid.\n";
            goto LAB_00584d94;
          }
          goto LAB_00584d67;
        }
        uVar7 = (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar11]->super_ON_Geometry
                  ).super_ON_Object._vptr_ON_Object[0x18])();
        if (uVar7 != uVar5) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"Polycurve segment[%d]->Dimension()=%d (should be %d).\n",
                              uVar11 & 0xffffffff,(ulong)uVar7,(ulong)uVar5);
          }
          goto LAB_00584d67;
        }
        pdVar3 = (this->m_t).m_a;
        if (pdVar3[uVar11 + 1] <= pdVar3[uVar11]) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,
                              "Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",
                              uVar11 & 0xffffffff,(ulong)((int)uVar11 + 1));
          }
          goto LAB_00584d67;
        }
        if ((uVar12 != 1 && !bAllowGaps) &&
           (iVar6 = (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar11]->
                      super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(),
           (char)iVar6 != '\0')) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00584d67;
          pcVar9 = "Polycurve segment[%d] is closed (%d segments).\n";
          uVar8 = uVar12;
          uVar12 = uVar11 & 0xffffffff;
          goto LAB_00584d60;
        }
        uVar11 = uVar11 + 1;
        if (uVar12 == uVar11) {
          bVar4 = true;
          if (!bAllowGaps) {
            iVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
            iVar10 = 1;
            if (1 < iVar6) {
              iVar10 = iVar6;
            }
            uVar12 = 0;
            do {
              uVar8 = uVar12;
              if (iVar10 + -1 == (int)uVar8) {
                return true;
              }
              bVar4 = HasGapAt(this,(int)uVar8);
              uVar12 = uVar8 + 1;
            } while (!bVar4);
            ON_Curve::PointAtEnd
                      (&local_48,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8]);
            ON_Curve::PointAtStart
                      (&local_60,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar12]);
            ON_3dPoint::DistanceTo(&local_48,&local_60);
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n"
                                ,uVar8,uVar12 & 0xffffffff);
            }
            bVar4 = ON_IsNotValid();
          }
          return bVar4;
        }
      } while( true );
    }
    if (text_log == (ON_TextLog *)0x0) goto LAB_00584d67;
    pcVar9 = "Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n";
  }
LAB_00584d60:
  ON_TextLog::Print(text_log,pcVar9,uVar12,uVar8);
LAB_00584d67:
  bVar4 = ON_IsNotValid();
  return bVar4;
}

Assistant:

bool ON_PolyCurve::IsValid( bool bAllowGaps, ON_TextLog* text_log ) const
{
  const int count = Count();
  const int dim = Dimension();
  ON_3dPoint p0, p1;
  int segment_index;
  if ( count <= 0 || dim <= 0 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and dim = %d\n",count,dim);
    return ON_IsNotValid();
  }

  if ( m_t.Count() != count+1 )
  {
    if ( text_log )
      text_log->Print("Polycurve segment count = %d and m_t.Count()=%d (should be segment count+1)\n",
                      count,m_t.Count());
    return ON_IsNotValid();
  }

  for ( segment_index = 0; segment_index < count; segment_index++ ) 
  {
    if ( 0 == m_segment[segment_index] )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is null.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    if ( !m_segment[segment_index]->IsValid( text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("Polycurve segment[%d] is not valid.\n",segment_index);
      }
      return ON_IsNotValid();
    }

    int seg_dim = m_segment[segment_index]->Dimension();
    if ( seg_dim != dim )
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d]->Dimension()=%d (should be %d).\n",segment_index,seg_dim,dim);
      return ON_IsNotValid(); // all segments must have same dimension
    }

    if ( m_t[segment_index] >= m_t[segment_index+1] )
    {
      if ( text_log )
        text_log->Print("Polycurve m_t[%d]=%g and m_t[%d]=%g (should be increasing)\n",
                         segment_index,   m_t[segment_index],
                         segment_index+1, m_t[segment_index+1]);
      return ON_IsNotValid(); // segment domain must be non-empty
    }

    if ( count > 1 && !bAllowGaps && m_segment[segment_index]->IsClosed() ) 
    {
      if ( text_log )
        text_log->Print("Polycurve segment[%d] is closed (%d segments).\n",segment_index,count);
      return ON_IsNotValid(); // closed segments not permitted in multi segment curve
    }
  }

  if ( !bAllowGaps )
  {
    // check for gaps
    int gap_index = FindNextGap(0);
    if ( gap_index > 0 )
    {
      p0 = m_segment[gap_index-1]->PointAtEnd();
      p1 = m_segment[gap_index]->PointAtStart();
      double d = p0.DistanceTo(p1);
      if ( text_log )
        text_log->Print("Polycurve end of segment[%d] != start of segment[%d] (distance=%g)\n",
                        gap_index-1, gap_index, d );
      return ON_IsNotValid(); // not contiguous
    }
  }

  return true;
}